

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O1

VisitReturn __thiscall QMakeEvaluator::visitProBlock(QMakeEvaluator *this,ushort *tokPtr)

{
  uint *puVar1;
  ProValueMapStack *this_00;
  size_t *psVar2;
  undefined2 uVar3;
  ushort uVar4;
  ProFile *this_01;
  QArrayData *pQVar5;
  uint *puVar6;
  VisitReturn VVar7;
  VisitReturn VVar8;
  CutResult CVar9;
  ulong uVar10;
  char *pcVar11;
  storage_type_conflict *psVar12;
  uint uVar13;
  long lVar14;
  long in_FS_OFFSET;
  QStringView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QArrayData *local_b0;
  undefined8 *local_a8;
  ProKey local_98;
  QArrayDataPointer<ProString> local_68;
  uint *local_48;
  storage_type_conflict *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = (uint *)tokPtr;
  if (this->m_debugLevel != 0) {
    traceMsgInternal(this,"entering block");
  }
  local_68.d = (Data *)0x0;
  local_68.ptr = (ProString *)0x0;
  local_68.size = 0;
  this_01 = (this->m_current).pro;
  this_00 = &this->m_valuemapStack;
LAB_00279724:
  puVar6 = local_48;
  puVar1 = (uint *)((long)local_48 + 2);
  uVar4 = (ushort)*local_48;
  VVar8 = ReturnBreak;
  pcVar11 = "break";
  lVar14 = 3;
  switch(uVar4) {
  case 1:
    goto switchD_00279766_caseD_1;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
    local_48 = puVar1;
    VVar7 = visitProVariable(this,uVar4,(ProStringList *)&local_68,(ushort **)&local_48);
    VVar8 = ReturnError;
    if (VVar7 != ReturnError) {
      QList<ProString>::clear((QList<ProString> *)&local_68);
      VVar8 = (*(code *)0x279724)();
      return VVar8;
    }
    goto LAB_0027a454;
  default:
    VVar8 = evaluateExpression(this,(ushort **)&local_48,(ProStringList *)&local_68,false);
    if ((VVar8 == ReturnError) || (lVar14 = 2, puVar1 = local_48, local_48 != puVar6))
    goto LAB_0027a454;
  case 0:
switchD_00279766_caseD_0:
    local_48 = puVar1;
    VVar8 = (*(code *)((long)&DAT_002b2ba0 + (long)(int)(&DAT_002b2ba0)[lVar14]))();
    return VVar8;
  case 0x10:
    QVar16.m_data = (storage_type *)0x2c;
    QVar16.m_size = (qsizetype)&local_98;
    local_48 = puVar1;
    QString::fromLatin1(QVar16);
    message(this,0x310,(QString *)&local_98);
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QList<ProString>::clear((QList<ProString> *)&local_68);
    VVar8 = (*(code *)0x279724)();
    return VVar8;
  case 0x11:
    QVar17.m_data = (storage_type *)0x2a;
    QVar17.m_size = (qsizetype)&local_98;
    local_48 = puVar1;
    QString::fromLatin1(QVar17);
    message(this,0x310,(QString *)&local_98);
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    skipExpression(this,(ushort **)&local_48);
    QList<ProString>::clear((QList<ProString> *)&local_68);
    VVar8 = (*(code *)0x279724)();
    return VVar8;
  case 0x12:
    local_48 = puVar1;
    QArrayDataPointer<ProString>::operator=
              ((QArrayDataPointer<ProString> *)&this->m_returnValue,&local_68);
    QList<ProString>::clear((QList<ProString> *)&local_68);
    VVar8 = ReturnReturn;
    pcVar11 = "return";
    puVar1 = local_48;
    break;
  case 0x13:
    break;
  case 0x14:
    VVar8 = ReturnNext;
    pcVar11 = "next";
    break;
  case 0x15:
    local_48 = puVar1;
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"NOT","break");
    }
    VVar8 = (*(code *)0x279724)();
    return VVar8;
  case 0x16:
    if (this->m_debugLevel != 0) {
      local_48 = puVar1;
      traceMsgInternal(this,"AND","break");
      VVar8 = (*(code *)0x279724)();
      return VVar8;
    }
    lVar14 = 2;
    goto switchD_00279766_caseD_0;
  case 0x17:
    if (this->m_debugLevel != 0) {
      local_48 = puVar1;
      traceMsgInternal(this,"OR","break");
      VVar8 = (*(code *)0x279724)();
      return VVar8;
    }
    lVar14 = 2;
    goto switchD_00279766_caseD_0;
  case 0x18:
    puVar1 = (uint *)((long)local_48 + 2);
    local_48 = (uint *)((long)local_48 + 6);
    uVar13 = *puVar1;
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"taking \'then\' branch","break");
    }
    if (uVar13 == 0) {
      VVar8 = ReturnTrue;
    }
    else {
      VVar8 = visitProBlock(this,(ushort *)local_48);
    }
    if (this->m_debugLevel != 0) {
      traceMsgInternal(this,"finished \'then\' branch");
    }
    uVar10 = (ulong)uVar13;
    uVar13 = CONCAT22(*(ushort *)((long)local_48 + (uVar10 + 1) * 2),
                      *(ushort *)((long)local_48 + uVar10 * 2));
    local_48 = (uint *)((long)local_48 + (uVar10 + 2) * 2);
    goto LAB_0027a443;
  case 0x19:
    local_48 = puVar1;
    ProFile::getHashStr(&local_98,this_01,(ushort **)&local_48);
    puVar1 = local_48 + 1;
    uVar3 = *(undefined2 *)((long)local_48 + (ulong)*local_48 * 2 + 4);
    local_48 = (uint *)((long)local_48 + (ulong)*local_48 * 2 + 8);
    uVar4 = *(ushort *)((long)local_48 + -2);
    VVar8 = visitProLoop(this,&local_98,(ushort *)puVar1,(ushort *)local_48);
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar13 = CONCAT22(uVar4,uVar3);
    goto LAB_0027a443;
  case 0x1a:
  case 0x1b:
    local_48 = puVar1;
    ProFile::getHashStr(&local_98,this_01,(ushort **)&local_48);
    puVar1 = local_48 + 1;
    uVar13 = *local_48;
    local_48 = puVar1;
    visitProFunctionDef(this,uVar4,&local_98,(ushort *)puVar1);
    if (this->m_debugLevel != 0) {
      pcVar11 = "replace";
      if (uVar4 == 0x1a) {
        pcVar11 = "test";
      }
      local_b0 = (QArrayData *)(long)local_98.super_ProString.m_offset;
      local_40 = (storage_type_conflict *)(long)local_98.super_ProString.m_length;
      CVar9 = QtPrivate::QContainerImplHelper::mid
                        (local_98.super_ProString.m_string.d.size,(qsizetype *)&local_b0,
                         (qsizetype *)&local_40);
      psVar12 = local_40;
      if (CVar9 == Null) {
        psVar12 = (storage_type_conflict *)0x0;
      }
      QVar15.m_data = psVar12;
      QVar15.m_size = (qsizetype)&local_b0;
      QtPrivate::convertToLocal8Bit(QVar15);
      if (local_a8 == (undefined8 *)0x0) {
        local_a8 = &QByteArray::_empty;
      }
      traceMsgInternal(this,"defined %s function %s",pcVar11,local_a8);
      if (local_b0 != (QArrayData *)0x0) {
        LOCK();
        (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_b0,1,0x10);
        }
      }
    }
    if (&(local_98.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    local_48 = (uint *)((long)local_48 + (ulong)uVar13 * 2);
    VVar8 = (*(code *)0x279724)();
    return VVar8;
  case 0x1c:
    puVar1 = (uint *)((long)local_48 + 2);
    local_48 = (uint *)((long)local_48 + 6);
    uVar13 = *puVar1;
    if (uVar13 == 0) {
      VVar8 = ReturnTrue;
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"skipped nesting-bypassing block","break");
      }
    }
    else {
      local_98.super_ProString.m_string.d.d =
           (Data *)(this->m_valuemapStack).
                   super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   .
                   super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
      local_98.super_ProString.m_string.d.ptr =
           (char16_t *)
           (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
      local_98.super_ProString.m_string.d.size =
           (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node._M_size;
      if ((ProValueMapStack *)local_98.super_ProString.m_string.d.d == this_00) {
        local_98.super_ProString.m_string.d.d = (Data *)&local_98;
        local_98.super_ProString.m_string.d.ptr = (char16_t *)local_98.super_ProString.m_string.d.d;
      }
      else {
        *(_List_node_base **)local_98.super_ProString.m_string.d.ptr = (_List_node_base *)&local_98;
        ((QArrayData *)local_98.super_ProString.m_string.d.d)->alloc = (qsizetype)&local_98;
        (this->m_valuemapStack).
        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
        ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
        (this->m_valuemapStack).
        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
        (this->m_valuemapStack).
        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
        super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
        ._M_impl._M_node._M_size = 0;
      }
      std::__cxx11::
      _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
      _M_clear((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                *)this_00);
      (this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)this_00;
      (this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)this_00;
      (this->m_valuemapStack).
      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
      _M_impl._M_node._M_size = 0;
      if ((ProValueMapStack *)*(undefined1 **)local_98.super_ProString.m_string.d.d != this_00 &&
          this_00 != (ProValueMapStack *)local_98.super_ProString.m_string.d.d) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)this_00,
                   (_List_node_base *)local_98.super_ProString.m_string.d.d);
        psVar2 = &(this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 + 1;
        local_98.super_ProString.m_string.d.size = local_98.super_ProString.m_string.d.size - 1;
      }
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"visiting nesting-bypassing block");
      }
      VVar8 = visitProBlock(this,(ushort *)local_48);
      if (this->m_debugLevel != 0) {
        traceMsgInternal(this,"visited nesting-bypassing block");
      }
      pQVar5 = (QArrayData *)
               (this_00->
               super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               ).
               super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
               ._M_impl._M_node.super__List_node_base._M_next;
      if (*(QArrayData **)pQVar5 != &(local_98.super_ProString.m_string.d.d)->super_QArrayData &&
          &(local_98.super_ProString.m_string.d.d)->super_QArrayData != pQVar5) {
        std::__detail::_List_node_base::_M_transfer
                  ((_List_node_base *)local_98.super_ProString.m_string.d.d,
                   (_List_node_base *)pQVar5);
        local_98.super_ProString.m_string.d.size = local_98.super_ProString.m_string.d.size + 1;
        psVar2 = &(this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node._M_size;
        *psVar2 = *psVar2 - 1;
      }
      std::__cxx11::list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
      ::_M_move_assign(&this_00->
                        super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ,&local_98);
      std::__cxx11::
      _List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>::
      _M_clear((_List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                *)&local_98);
    }
LAB_0027a443:
    local_48 = (uint *)((long)local_48 + (ulong)uVar13 * 2);
LAB_0027a454:
    lVar14 = 0;
    puVar1 = local_48;
    if (ReturnTrue < VVar8) {
      if (this->m_debugLevel != 0) {
        if (VVar8 - ReturnError < 3) {
          pcVar11 = (&PTR_anon_var_dwarf_72d6ee_002e0e60)[VVar8 - ReturnError];
        }
        else {
          pcVar11 = "<invalid>";
          if (VVar8 == ReturnReturn) {
            pcVar11 = "return";
          }
        }
        traceMsgInternal(this,"aborting block, status: %s",pcVar11);
      }
      goto LAB_0027a713;
    }
    goto switchD_00279766_caseD_0;
  }
  local_48 = puVar1;
  if (this->m_debugLevel != 0) {
    traceMsgInternal(this,"flow control statement \'%s\', aborting block",pcVar11);
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return VVar8;
    }
    __stack_chk_fail();
  }
LAB_0027a713:
  lVar14 = 1;
  puVar1 = local_48;
  goto switchD_00279766_caseD_0;
switchD_00279766_caseD_1:
  (this->m_current).line = *(ushort *)((long)local_48 + 2);
  local_48 = local_48 + 1;
  goto LAB_00279724;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProBlock(
        const ushort *tokPtr)
{
    traceMsg("entering block");
    ProStringList curr;
    ProFile *pro = m_current.pro;
    bool okey = true, or_op = false, invert = false;
    uint blockLen;
    while (ushort tok = *tokPtr++) {
        VisitReturn ret;
        switch (tok) {
        case TokLine:
            m_current.line = *tokPtr++;
            continue;
        case TokAssign:
        case TokAppend:
        case TokAppendUnique:
        case TokRemove:
        case TokReplace:
            ret = visitProVariable(tok, curr, tokPtr);
            if (ret == ReturnError)
                break;
            curr.clear();
            continue;
        case TokBranch:
            blockLen = getBlockLen(tokPtr);
            if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                if (!okey)
                    m_skipLevel++;
                ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey)
                    m_skipLevel--;
                else
                    m_skipLevel++;
                if ((ret == ReturnTrue || ret == ReturnFalse) && blockLen)
                    ret = visitProBlock(tokPtr);
                if (okey)
                    m_skipLevel--;
#endif
            } else {
                if (okey) {
                    traceMsg("taking 'then' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'then' branch");
                }
                tokPtr += blockLen;
                blockLen = getBlockLen(tokPtr);
                if (!okey) {
                    traceMsg("taking 'else' branch");
                    ret = blockLen ? visitProBlock(tokPtr) : ReturnTrue;
                    traceMsg("finished 'else' branch");
                }
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokForLoop:
            if (m_cumulative || okey != or_op) {
                const ProKey &variable = pro->getHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                const ushort *exprPtr = tokPtr;
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                ret = visitProLoop(variable, exprPtr, tokPtr);
            } else {
                skipHashStr(tokPtr);
                uint exprLen = getBlockLen(tokPtr);
                tokPtr += exprLen;
                blockLen = getBlockLen(tokPtr);
                traceMsg("skipped loop");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokBypassNesting:
            blockLen = getBlockLen(tokPtr);
            if ((m_cumulative || okey != or_op) && blockLen) {
                ProValueMapStack savedValuemapStack = std::move(m_valuemapStack);
                m_valuemapStack.clear();
                m_valuemapStack.splice(m_valuemapStack.end(),
                                       savedValuemapStack, savedValuemapStack.begin());
                traceMsg("visiting nesting-bypassing block");
                ret = visitProBlock(tokPtr);
                traceMsg("visited nesting-bypassing block");
                savedValuemapStack.splice(savedValuemapStack.begin(),
                                          m_valuemapStack, m_valuemapStack.begin());
                m_valuemapStack = std::move(savedValuemapStack);
            } else {
                traceMsg("skipped nesting-bypassing block");
                ret = ReturnTrue;
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            break;
        case TokTestDef:
        case TokReplaceDef:
            if (m_cumulative || okey != or_op) {
                const ProKey &name = pro->getHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
                visitProFunctionDef(tok, name, tokPtr);
                traceMsg("defined %s function %s",
                      tok == TokTestDef ? "test" : "replace", dbgKey(name));
            } else {
                traceMsg("skipped function definition");
                skipHashStr(tokPtr);
                blockLen = getBlockLen(tokPtr);
            }
            tokPtr += blockLen;
            okey = true, or_op = false; // force next evaluation
            continue;
        case TokNot:
            traceMsg("NOT");
            invert ^= true;
            continue;
        case TokAnd:
            traceMsg("AND");
            or_op = false;
            continue;
        case TokOr:
            traceMsg("OR");
            or_op = true;
            continue;
        case TokCondition:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Conditional must expand to exactly one word."));
                    okey = false;
                } else {
                    okey = isActiveConfig(curr.at(0).toQStringView(), true);
                    traceMsg("condition %s is %s", dbgStr(curr.at(0)), dbgBool(okey));
                    okey ^= invert;
                }
            } else {
                traceMsg("skipped condition %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokTestCall:
            if (!m_skipLevel && okey != or_op) {
                if (curr.size() != 1) {
                    if (!m_cumulative || !curr.isEmpty())
                        evalError(fL1S("Test name must expand to exactly one word."));
                    skipExpression(tokPtr);
                    okey = false;
                } else {
                    traceMsg("evaluating test function %s", dbgStr(curr.at(0)));
                    ret = evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                    switch (ret) {
                    case ReturnTrue: okey = true; break;
                    case ReturnFalse: okey = false; break;
                    default:
                        traceMsg("aborting block, function status: %s", dbgReturn(ret));
                        return ret;
                    }
                    traceMsg("test function returned %s", dbgBool(okey));
                    okey ^= invert;
                }
            } else if (m_cumulative) {
#ifdef PROEVALUATOR_CUMULATIVE
                m_skipLevel++;
                if (curr.size() != 1)
                    skipExpression(tokPtr);
                else
                    evaluateConditionalFunction(curr.at(0).toKey(), tokPtr);
                m_skipLevel--;
#endif
            } else {
                skipExpression(tokPtr);
                traceMsg("skipped test function %s", curr.size() == 1 ? dbgStr(curr.at(0)) : "<invalid>");
            }
            or_op = !okey; // tentatively force next evaluation
            invert = false;
            curr.clear();
            continue;
        case TokReturn:
            m_returnValue = curr;
            curr.clear();
            ret = ReturnReturn;
            goto ctrlstm;
        case TokBreak:
            ret = ReturnBreak;
            goto ctrlstm;
        case TokNext:
            ret = ReturnNext;
          ctrlstm:
            if (!m_skipLevel && okey != or_op) {
                traceMsg("flow control statement '%s', aborting block", dbgReturn(ret));
                return ret;
            }
            traceMsg("skipped flow control statement '%s'", dbgReturn(ret));
            okey = false, or_op = true; // force next evaluation
            continue;
        default: {
                const ushort *oTokPtr = --tokPtr;
                ret = evaluateExpression(tokPtr, &curr, false);
                if (ret == ReturnError || tokPtr != oTokPtr)
                    break;
            }
            Q_ASSERT_X(false, "visitProBlock", "unexpected item type");
            continue;
        }
        if (ret != ReturnTrue && ret != ReturnFalse) {
            traceMsg("aborting block, status: %s", dbgReturn(ret));
            return ret;
        }
    }
    traceMsg("leaving block, okey=%s", dbgBool(okey));
    return returnBool(okey);
}